

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::triangulateSelection(Scene *this)

{
  SceneObject *pSVar1;
  long local_30;
  Mesh *mesh;
  Scene *this_local;
  
  pSVar1 = (this->selected).object;
  if (pSVar1 == (SceneObject *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = __dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
  }
  if (local_30 != 0) {
    HalfedgeMesh::triangulate((HalfedgeMesh *)(local_30 + 0xf0));
    clearSelections(this);
  }
  return;
}

Assistant:

void Scene::triangulateSelection()
{
   Mesh* mesh = dynamic_cast<Mesh*>( selected.object );
   if( mesh )
   {
      mesh->mesh.triangulate();
      clearSelections();
   }
}